

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t verify_global_checksums(archive_read *a)

{
  void *pvVar1;
  char *fmt;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint8_t b2_buf [32];
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 8) != 0) {
    return L'\0';
  }
  if ((*(int *)((long)pvVar1 + 0x4bec) == 0) ||
     (*(int *)((long)pvVar1 + 0x4bf0) == *(int *)((long)pvVar1 + 0x4bec))) {
    if (*(char *)((long)pvVar1 + 0x52f0) < '\x01') {
      return L'\0';
    }
    blake2sp_final((blake2sp_state *)((long)pvVar1 + 0x4c18),&local_48,0x20);
    auVar3[0] = -(*(char *)((long)pvVar1 + 0x4c04) == local_38);
    auVar3[1] = -(*(char *)((long)pvVar1 + 0x4c05) == cStack_37);
    auVar3[2] = -(*(char *)((long)pvVar1 + 0x4c06) == cStack_36);
    auVar3[3] = -(*(char *)((long)pvVar1 + 0x4c07) == cStack_35);
    auVar3[4] = -(*(char *)((long)pvVar1 + 0x4c08) == cStack_34);
    auVar3[5] = -(*(char *)((long)pvVar1 + 0x4c09) == cStack_33);
    auVar3[6] = -(*(char *)((long)pvVar1 + 0x4c0a) == cStack_32);
    auVar3[7] = -(*(char *)((long)pvVar1 + 0x4c0b) == cStack_31);
    auVar3[8] = -(*(char *)((long)pvVar1 + 0x4c0c) == cStack_30);
    auVar3[9] = -(*(char *)((long)pvVar1 + 0x4c0d) == cStack_2f);
    auVar3[10] = -(*(char *)((long)pvVar1 + 0x4c0e) == cStack_2e);
    auVar3[0xb] = -(*(char *)((long)pvVar1 + 0x4c0f) == cStack_2d);
    auVar3[0xc] = -(*(char *)((long)pvVar1 + 0x4c10) == cStack_2c);
    auVar3[0xd] = -(*(char *)((long)pvVar1 + 0x4c11) == cStack_2b);
    auVar3[0xe] = -(*(char *)((long)pvVar1 + 0x4c12) == cStack_2a);
    auVar3[0xf] = -(*(char *)((long)pvVar1 + 0x4c13) == cStack_29);
    auVar2[0] = -(*(char *)((long)pvVar1 + 0x4bf4) == local_48);
    auVar2[1] = -(*(char *)((long)pvVar1 + 0x4bf5) == cStack_47);
    auVar2[2] = -(*(char *)((long)pvVar1 + 0x4bf6) == cStack_46);
    auVar2[3] = -(*(char *)((long)pvVar1 + 0x4bf7) == cStack_45);
    auVar2[4] = -(*(char *)((long)pvVar1 + 0x4bf8) == cStack_44);
    auVar2[5] = -(*(char *)((long)pvVar1 + 0x4bf9) == cStack_43);
    auVar2[6] = -(*(char *)((long)pvVar1 + 0x4bfa) == cStack_42);
    auVar2[7] = -(*(char *)((long)pvVar1 + 0x4bfb) == cStack_41);
    auVar2[8] = -(*(char *)((long)pvVar1 + 0x4bfc) == cStack_40);
    auVar2[9] = -(*(char *)((long)pvVar1 + 0x4bfd) == cStack_3f);
    auVar2[10] = -(*(char *)((long)pvVar1 + 0x4bfe) == cStack_3e);
    auVar2[0xb] = -(*(char *)((long)pvVar1 + 0x4bff) == cStack_3d);
    auVar2[0xc] = -(*(char *)((long)pvVar1 + 0x4c00) == cStack_3c);
    auVar2[0xd] = -(*(char *)((long)pvVar1 + 0x4c01) == cStack_3b);
    auVar2[0xe] = -(*(char *)((long)pvVar1 + 0x4c02) == cStack_3a);
    auVar2[0xf] = -(*(char *)((long)pvVar1 + 0x4c03) == cStack_39);
    auVar2 = auVar2 & auVar3;
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff) {
      return L'\0';
    }
    fmt = "Checksum error: BLAKE2";
  }
  else {
    fmt = "Checksum error: CRC32";
  }
  archive_set_error(&a->archive,0x54,fmt);
  return L'\xffffffe2';
}

Assistant:

static int verify_checksums(struct archive_read* a) {
	int verify_crc;
	struct rar5* rar = get_context(a);

	/* Check checksums only when actually unpacking the data. There's no
	 * need to calculate checksum when we're skipping data in solid archives
	 * (skipping in solid archives is the same thing as unpacking compressed
	 * data and discarding the result). */

	if(!rar->skip_mode) {
		/* Always check checksums if we're not in skip mode */
		verify_crc = 1;
	} else {
		/* We can override the logic above with a compile-time option
		 * NO_CRC_ON_SOLID_SKIP. This option is used during debugging,
		 * and it will check checksums of unpacked data even when
		 * we're skipping it. */

#if defined CHECK_CRC_ON_SOLID_SKIP
		/* Debug case */
		verify_crc = 1;
#else
		/* Normal case */
		verify_crc = 0;
#endif
	}

	if(verify_crc) {
		/* During unpacking, on each unpacked block we're calling the
		 * update_crc() function. Since we are here, the unpacking
		 * process is already over and we can check if calculated
		 * checksum (CRC32 or BLAKE2sp) is the same as what is stored
		 * in the archive. */
		if(rar->file.stored_crc32 > 0) {
			/* Check CRC32 only when the file contains a CRC32
			 * value for this file. */

			if(rar->file.calculated_crc32 !=
			    rar->file.stored_crc32) {
				/* Checksums do not match; the unpacked file
				 * is corrupted. */

				DEBUG_CODE {
					printf("Checksum error: CRC32 "
					    "(was: %08" PRIx32 ", expected: %08" PRIx32 ")\n",
					    rar->file.calculated_crc32,
					    rar->file.stored_crc32);
				}

#ifndef DONT_FAIL_ON_CRC_ERROR
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Checksum error: CRC32");
				return ARCHIVE_FATAL;
#endif
			} else {
				DEBUG_CODE {
					printf("Checksum OK: CRC32 "
					    "(%08" PRIx32 "/%08" PRIx32 ")\n",
					    rar->file.stored_crc32,
					    rar->file.calculated_crc32);
				}
			}
		}

		if(rar->file.has_blake2 > 0) {
			/* BLAKE2sp is an optional checksum algorithm that is
			 * added to RARv5 archives when using the `-htb` switch
			 *  during creation of archive.
			 *
			 * We now finalize the hash calculation by calling the
			 * `final` function. This will generate the final hash
			 * value we can use to compare it with the BLAKE2sp
			 * checksum that is stored in the archive.
			 *
			 * The return value of this `final` function is not
			 * very helpful, as it guards only against improper use.
 			 * This is why we're explicitly ignoring it. */

			uint8_t b2_buf[32];
			(void) blake2sp_final(&rar->file.b2state, b2_buf, 32);

			if(memcmp(&rar->file.blake2sp, b2_buf, 32) != 0) {
#ifndef DONT_FAIL_ON_CRC_ERROR
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Checksum error: BLAKE2");

				return ARCHIVE_FATAL;
#endif
			}
		}
	}

	/* Finalization for this file has been successfully completed. */
	return ARCHIVE_OK;
}